

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HModel.cpp
# Opt level: O0

void __thiscall HModel::computePrimal(HModel *this)

{
  int iVar1;
  reference pvVar2;
  reference pvVar3;
  long in_RDI;
  vector<double,_std::allocator<double>_> *this_00;
  double extraout_XMM0_Qa;
  double in_stack_00000008;
  int in_stack_00000014;
  HVector *in_stack_00000018;
  HMatrix *in_stack_00000020;
  double dl_pr;
  int iCol;
  int i_1;
  double norm_dl_pr;
  int mx_n_rp;
  double rp_tl;
  int n_rp;
  int i;
  double in_stack_ffffffffffffff90;
  value_type vVar4;
  HVector *in_stack_ffffffffffffff98;
  HFactor *in_stack_ffffffffffffffa0;
  HVector *in_stack_ffffffffffffffb0;
  int local_2c;
  double local_28;
  double local_18;
  int local_10;
  int local_c;
  
  HVector::clear(in_stack_ffffffffffffffb0);
  for (local_c = 0; local_c < *(int *)(in_RDI + 0x614); local_c = local_c + 1) {
    pvVar2 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x768),(long)local_c);
    if (*pvVar2 != 0) {
      pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x828),(long)local_c)
      ;
      if ((*pvVar3 != 0.0) || (NAN(*pvVar3))) {
        std::vector<double,_std::allocator<double>_>::operator[]
                  ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x828),(long)local_c);
        HMatrix::collect_aj(in_stack_00000020,in_stack_00000018,in_stack_00000014,in_stack_00000008)
        ;
      }
    }
  }
  HFactor::ftran(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,in_stack_ffffffffffffff90);
  local_10 = 0;
  local_18 = 0.0;
  local_28 = 0.0;
  for (local_2c = 0; local_2c < *(int *)(in_RDI + 0x610); local_2c = local_2c + 1) {
    pvVar2 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x750),(long)local_2c);
    iVar1 = *pvVar2;
    std::vector<double,_std::allocator<double>_>::operator[]
              ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x870),(long)local_2c);
    this_00 = (vector<double,_std::allocator<double>_> *)(in_RDI + 0xed8);
    std::vector<double,_std::allocator<double>_>::operator[](this_00,(long)local_2c);
    std::abs((int)this_00);
    if ((local_18 < extraout_XMM0_Qa) && (local_10 < 10)) {
      local_18 = extraout_XMM0_Qa * 10.0;
      local_10 = local_10 + 1;
    }
    local_28 = extraout_XMM0_Qa * extraout_XMM0_Qa + local_28;
    pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)(in_RDI + 0xed8),(long)local_2c);
    vVar4 = *pvVar3;
    pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x870),(long)local_2c);
    *pvVar3 = -vVar4;
    pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x7e0),(long)iVar1);
    vVar4 = *pvVar3;
    pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x840),(long)local_2c);
    *pvVar3 = vVar4;
    pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x7f8),(long)iVar1);
    vVar4 = *pvVar3;
    pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x858),(long)local_2c);
    *pvVar3 = vVar4;
  }
  sqrt(local_28);
  *(undefined4 *)(in_RDI + 0x600) = 1;
  return;
}

Assistant:

void HModel::computePrimal() {
    buffer.clear();
    for (int i = 0; i < numTot; i++)
        if (nonbasicFlag[i] && workValue[i] != 0)
            matrix.collect_aj(buffer, i, workValue[i]);
    factor.ftran(buffer, 1);

#ifdef JAJH_dev
    int n_rp = 0;
    double rp_tl = 0.0;
    int mx_n_rp = 10;
    double norm_dl_pr = 0.0;
#endif

    for (int i = 0; i < numRow; i++) {
        int iCol = basicIndex[i];
#ifdef JAJH_dev
	double dl_pr = abs(baseValue[i] +buffer.array[i]);
	if (dl_pr > rp_tl && n_rp < mx_n_rp) {
	  rp_tl = dl_pr*10;
	  n_rp += 1;
	  //	  printf("computePrimal():   DlPr_i = %11g for i = %d\n", dl_pr, i);
	}
	norm_dl_pr += dl_pr*dl_pr;
#endif
        baseValue[i] = -buffer.array[i];
        baseLower[i] = workLower[iCol];
        baseUpper[i] = workUpper[iCol];
    }
#ifdef JAJH_dev
    norm_dl_pr = sqrt(norm_dl_pr);
    //    printf("computePrimal(): ||DlPr|| = %11g\n", norm_dl_pr);
#endif
    //Now have a basic primals
    mlFg_haveBasicPrimals = 1;
}